

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testGcSafePoints(void)

{
  MutatorThread thread2;
  MutatorThread thread1;
  Gc gc;
  MutatorThread local_148;
  MutatorThread local_130;
  Gc local_118;
  
  Gc::Gc(&local_118);
  g_gc = &local_118;
  puts("starting mutator threads...");
  local_130.super_ThreadImpl<MutatorThread>.super_ThreadImplRoot.m_thread.m_isOpen = false;
  local_130.m_terminateFlag = false;
  local_148.super_ThreadImpl<MutatorThread>.super_ThreadImplRoot.m_thread.m_isOpen = false;
  local_148.m_terminateFlag = false;
  axl::sys::ThreadImpl<MutatorThread>::start(&local_130.super_ThreadImpl<MutatorThread>);
  axl::sys::ThreadImpl<MutatorThread>::start(&local_148.super_ThreadImpl<MutatorThread>);
  Gc::registerThread(&local_118,
                     local_130.super_ThreadImpl<MutatorThread>.super_ThreadImplRoot.m_thread.
                     m_threadId);
  Gc::registerThread(&local_118,
                     local_148.super_ThreadImpl<MutatorThread>.super_ThreadImplRoot.m_thread.
                     m_threadId);
  axl::sys::sleep(1000);
  puts("stopping the world...");
  Gc::stopTheWorld(&local_118);
  puts("the world is stopped.");
  axl::sys::sleep(2000);
  puts("resuming the world...");
  Gc::resumeTheWorld(&local_118);
  axl::sys::sleep(1000);
  puts("stopping mutator threads...");
  MutatorThread::stop(&local_130);
  MutatorThread::stop(&local_148);
  puts("done.");
  g_gc = (Gc *)0x0;
  axl::sys::ThreadImpl<MutatorThread>::~ThreadImpl(&local_148.super_ThreadImpl<MutatorThread>);
  axl::sys::ThreadImpl<MutatorThread>::~ThreadImpl(&local_130.super_ThreadImpl<MutatorThread>);
  Gc::~Gc(&local_118);
  return;
}

Assistant:

void
testGcSafePoints() {
	Gc gc;

	g_gc = &gc;

	printf("starting mutator threads...\n");

	MutatorThread thread1;
	MutatorThread thread2;

	thread1.start();
	thread2.start();

	gc.registerThread(thread1.getThreadId());
	gc.registerThread(thread2.getThreadId());

	sys::sleep(1000);

	printf("stopping the world...\n");
	gc.stopTheWorld();
	printf("the world is stopped.\n");

	sys::sleep(2000);

	printf("resuming the world...\n");
	gc.resumeTheWorld();

	sys::sleep(1000);

	printf("stopping mutator threads...\n");

	thread1.stop();
	thread2.stop();

	printf("done.\n");

	g_gc = NULL;
}